

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O1

void device_reset_k053260(void *chip)

{
  undefined8 *puVar1;
  long lVar2;
  
  *(undefined4 *)((long)chip + 0x20) = 0;
  *(undefined2 *)((long)chip + 0x24) = 0;
  lVar2 = 0x30;
  do {
    puVar1 = (undefined8 *)((long)chip + lVar2 + 0xd);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)chip + lVar2) = 0;
    ((undefined8 *)((long)chip + lVar2))[1] = 0;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0xd0);
  *(undefined8 *)((long)chip + 0xe0) = 0;
  return;
}

Assistant:

static void device_reset_k053260(void* chip)
{
	k053260_state *info = (k053260_state *)chip;
	int i;

	memset(info->portdata, 0, sizeof(info->portdata));

	info->keyon = 0;
	info->mode = 0;

	for (i = 0; i < 4; i++)
		KDSC_voice_reset(&info->voice[i]);

	RC_RESET(&info->cycleCntr);

	return;
}